

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O1

void __thiscall
prometheus::Exposer::RegisterAuth
          (Exposer *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *authCB,string *realm,string *uri)

{
  _Manager_type p_Var1;
  int iVar2;
  Endpoint *this_00;
  undefined8 uVar3;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    this_00 = GetEndpointForUri(this,uri);
    local_48._M_unused._M_object = (void *)0x0;
    local_48._8_8_ = 0;
    local_38 = (_Manager_type)0x0;
    local_30 = authCB->_M_invoker;
    p_Var1 = (authCB->super__Function_base)._M_manager;
    if (p_Var1 != (_Manager_type)0x0) {
      local_48._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(authCB->super__Function_base)._M_functor;
      local_48._8_8_ = *(undefined8 *)((long)&(authCB->super__Function_base)._M_functor + 8);
      (authCB->super__Function_base)._M_manager = (_Manager_type)0x0;
      authCB->_M_invoker = (_Invoker_type)0x0;
      local_38 = p_Var1;
    }
    detail::Endpoint::RegisterAuth
              (this_00,(function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_48,realm);
    if (local_38 != (_Manager_type)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  __clang_call_terminate(uVar3);
}

Assistant:

void Exposer::RegisterAuth(
    std::function<bool(const std::string&, const std::string&)> authCB,
    const std::string& realm, const std::string& uri) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto& endpoint = GetEndpointForUri(uri);
  endpoint.RegisterAuth(std::move(authCB), realm);
}